

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O3

void Block4Stream_Close(TBlockStream *pStream)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  undefined4 *__ptr;
  
  __ptr = (undefined4 *)pStream->FileBitmap;
  if (__ptr != (undefined4 *)0x0) {
    if (pStream->BitmapSize != 0) {
      uVar8 = 0;
      do {
        (pStream->super_TFileStream).Base.Http.hConnect = *(HANDLE *)(__ptr + 8);
        uVar1 = *__ptr;
        uVar2 = __ptr[1];
        uVar3 = __ptr[2];
        uVar4 = __ptr[3];
        uVar5 = __ptr[5];
        uVar6 = __ptr[6];
        uVar7 = __ptr[7];
        *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0x10) = __ptr[4];
        *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0x14) = uVar5;
        *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0x18) = uVar6;
        *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0x1c) = uVar7;
        *(undefined4 *)&(pStream->super_TFileStream).Base = uVar1;
        *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 4) = uVar2;
        *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 8) = uVar3;
        *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0xc) = uVar4;
        (*(pStream->super_TFileStream).BaseClose)(&pStream->super_TFileStream);
        uVar8 = uVar8 + 1;
        __ptr = __ptr + 10;
      } while (uVar8 < pStream->BitmapSize);
      __ptr = (undefined4 *)pStream->FileBitmap;
      if (__ptr == (undefined4 *)0x0) goto LAB_0010e90f;
    }
    free(__ptr);
  }
LAB_0010e90f:
  pStream->FileBitmap = (void *)0x0;
  return;
}

Assistant:

static void Block4Stream_Close(TBlockStream * pStream)
{
    TBaseProviderData * BaseArray = (TBaseProviderData *)pStream->FileBitmap;

    // If we have a non-zero count of base streams,
    // we have to close them all
    if(BaseArray != NULL)
    {
        // Close all base streams
        for(DWORD i = 0; i < pStream->BitmapSize; i++)
        {
            memcpy(&pStream->Base, BaseArray + i, sizeof(TBaseProviderData));
            pStream->BaseClose(pStream);
        }
    }

    // Free the data map, if any
    if(pStream->FileBitmap != NULL)
        CASC_FREE(pStream->FileBitmap);
    pStream->FileBitmap = NULL;

    // Do not call the BaseClose function,
    // we closed all handles already
    return;
}